

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_code.cpp
# Opt level: O1

char * Am_Check_Int_Type(Am_Value *value)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  
  if (value->type == 2) {
    return (char *)0x0;
  }
  bVar1 = Am_Value::Safe(value);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"** Amulet error, Expected int type in Object but got ",0x35);
    poVar2 = operator<<((ostream *)&std::cerr,value);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
    pcVar3 = "int type check error";
  }
  else {
    pcVar3 = (char *)0x0;
  }
  return pcVar3;
}

Assistant:

const char *
Am_Check_Int_Type(const Am_Value &value)
{
  if (value.type == Am_INT || !value.Safe())
    return nullptr;
  else {
    std::cerr << "** Amulet error, Expected int type in Object but got "
              << value << std::endl
              << std::flush;
    return "int type check error";
  }
}